

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::readExt<(moira::Core)2,2>(Moira *this)

{
  ushort uVar1;
  u32 result;
  Moira *this_local;
  
  uVar1 = (this->queue).irc;
  readExt<(moira::Core)2>(this);
  return (uint)uVar1;
}

Assistant:

u32
Moira::readExt()
{
    u32 result = queue.irc;
    readExt<C>();

    if constexpr (S == Long) {

        result = result << 16 | queue.irc;
        readExt<C>();
    }

    return result;
}